

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

UniValue *
RPCConvertNamedValues
          (UniValue *__return_storage_ptr__,string *strMethod,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *strParams)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer __s;
  long *__n_00;
  string key;
  string key_00;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  size_type sVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pUVar6;
  pointer pUVar7;
  pointer pUVar8;
  void *pvVar9;
  undefined8 uVar10;
  long *plVar11;
  _Alloc_hider _Var12;
  pointer pbVar13;
  size_type __n;
  long *plVar14;
  long in_FS_OFFSET;
  string_view arg_value;
  string_view arg_value_00;
  string name;
  UniValue positional_args;
  undefined8 in_stack_fffffffffffffda8;
  pointer pbVar15;
  VType in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  _Alloc_hider in_stack_fffffffffffffdd0;
  size_type in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  pointer in_stack_fffffffffffffdf0;
  pointer in_stack_fffffffffffffdf8;
  pointer in_stack_fffffffffffffe00;
  pointer in_stack_fffffffffffffe08;
  pointer in_stack_fffffffffffffe10;
  pointer in_stack_fffffffffffffe18;
  long *local_1e0 [2];
  long local_1d0 [2];
  UniValue local_1c0;
  long *local_168 [2];
  long local_158 [2];
  string local_148;
  UniValue local_128;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [9];
  undefined4 local_b7;
  undefined2 local_b3;
  char local_b1;
  UniValue local_b0;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0 = local_c0;
  local_c8 = 0;
  local_b0.val._M_dataplus._M_p = (pointer)&local_b0.val.field_2;
  local_b0.typ = VARR;
  local_b0.val.field_2._M_local_buf[0] = '\0';
  local_b0.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_c0._1_8_;
  local_b0.val.field_2._M_local_buf[8] = SUB81(local_c0._1_8_,7);
  local_b0.val.field_2._9_4_ = local_b7;
  local_b0.val.field_2._13_2_ = local_b3;
  local_b0.val.field_2._M_local_buf[0xf] = local_b1;
  local_b0.val._M_string_length = 0;
  local_c0[0] = 0;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar13 = (strParams->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar15 = (strParams->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar13 != pbVar15) {
    do {
      __s = (pbVar13->_M_dataplus)._M_p;
      __n_00 = (long *)pbVar13->_M_string_length;
      if (__n_00 == (long *)0x0) {
        plVar14 = (long *)0xffffffffffffffff;
      }
      else {
        pvVar9 = memchr(__s,0x3d,(size_t)__n_00);
        plVar14 = (long *)(-(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)__s);
      }
      if (plVar14 == (long *)0xffffffffffffffff) {
        arg_value_00._M_str = __s;
        arg_value_00._M_len = (size_t)__n_00;
        CRPCConvertTable::ArgToUniValue
                  (&local_128,&rpcCvtTable,arg_value_00,strMethod,
                   (int)((ulong)((long)local_b0.values.
                                       super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_b0.values.
                                      super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x45d1745d)
        ;
        val.val._M_dataplus._M_p = (pointer)__return_storage_ptr__;
        val._0_8_ = in_stack_fffffffffffffda8;
        val.val._M_string_length = (size_type)strMethod;
        val.val.field_2._M_allocated_capacity = (size_type)pbVar15;
        val.val.field_2._8_4_ = in_stack_fffffffffffffdc8;
        val.val.field_2._12_4_ = in_stack_fffffffffffffdcc;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdd0._M_p;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdd8;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffde0;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffde8;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdf0;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffdf8;
        UniValue::push_back(&local_b0,val);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_128.keys);
        uVar10 = local_128.val.field_2._M_allocated_capacity;
        _Var12._M_p = local_128.val._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128.val._M_dataplus._M_p != &local_128.val.field_2) {
LAB_0013a246:
          operator_delete(_Var12._M_p,uVar10 + 1);
        }
      }
      else {
        plVar11 = plVar14;
        if (__n_00 < plVar14) {
          plVar11 = __n_00;
        }
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,__s,(pointer)((long)plVar11 + (long)__s));
        lVar1 = (long)plVar14 + 1;
        if (__n_00 <= plVar14) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar10 = std::__throw_out_of_range_fmt
                               ("%s: __pos (which is %zu) > __size (which is %zu)",
                                "basic_string_view::substr",lVar1,__n_00);
            UniValue::~UniValue((UniValue *)&stack0xfffffffffffffdc8);
            if (local_1e0[0] != __n_00) {
              operator_delete(local_1e0[0],local_1d0[0] + 1);
            }
            UniValue::~UniValue(&local_b0);
            UniValue::~UniValue(__return_storage_ptr__);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar10);
            }
          }
          goto LAB_0013a540;
        }
        local_168[0] = local_158;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_168,local_148._M_dataplus._M_p,
                   local_148._M_dataplus._M_p + local_148._M_string_length);
        arg_value._M_str = __s + lVar1;
        arg_value._M_len = (long)__n_00 - lVar1;
        CRPCConvertTable::ArgToUniValue(&local_1c0,&rpcCvtTable,arg_value,strMethod,&local_148);
        key._M_string_length = (size_type)__return_storage_ptr__;
        key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffda8;
        key.field_2._M_allocated_capacity = (size_type)strMethod;
        key.field_2._8_8_ = pbVar15;
        val_00._4_4_ = in_stack_fffffffffffffdcc;
        val_00.typ = in_stack_fffffffffffffdc8;
        val_00.val._M_dataplus._M_p = in_stack_fffffffffffffdd0._M_p;
        val_00.val._M_string_length = in_stack_fffffffffffffdd8;
        val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffffde0;
        val_00.val.field_2._8_8_ = in_stack_fffffffffffffde8;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffdf0;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdf8;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe00;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = in_stack_fffffffffffffe08;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = in_stack_fffffffffffffe10;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe18;
        UniValue::pushKV(__return_storage_ptr__,key,val_00);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1c0.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c0.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0.val._M_dataplus._M_p != &local_1c0.val.field_2) {
          operator_delete(local_1c0.val._M_dataplus._M_p,
                          local_1c0.val.field_2._M_allocated_capacity + 1);
        }
        if (local_168[0] != local_158) {
          operator_delete(local_168[0],local_158[0] + 1);
        }
        uVar10 = local_148.field_2._M_allocated_capacity;
        _Var12._M_p = local_148._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_0013a246;
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar15);
  }
  if (local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_1e0[0] = local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"args","");
    pUVar8 = local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pUVar7 = local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pUVar6 = local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar5 = local_b0.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar4 = local_b0.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar13 = local_b0.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar3 = local_b0.val._M_string_length;
    paVar2 = &local_b0.val.field_2;
    _Var12._M_p = local_b0.val._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.val._M_dataplus._M_p == paVar2) {
      in_stack_fffffffffffffde8 =
           CONCAT17(local_b0.val.field_2._M_local_buf[0xf],
                    CONCAT25(local_b0.val.field_2._13_2_,
                             CONCAT41(local_b0.val.field_2._9_4_,
                                      local_b0.val.field_2._M_local_buf[8])));
      _Var12._M_p = (pointer)&stack0xfffffffffffffde0;
    }
    uVar10._1_7_ = local_b0.val.field_2._M_allocated_capacity._1_7_;
    uVar10._0_1_ = local_b0.val.field_2._M_local_buf[0];
    local_b0.val._M_string_length = 0;
    local_b0.val.field_2._M_local_buf[0] = '\0';
    local_b0.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    key_00._M_string_length = (size_type)__return_storage_ptr__;
    key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffda8;
    key_00.field_2._M_allocated_capacity = (size_type)strMethod;
    key_00.field_2._8_8_ = pbVar15;
    val_01._4_4_ = in_stack_fffffffffffffdcc;
    val_01.typ = local_b0.typ;
    val_01.val._M_dataplus._M_p = _Var12._M_p;
    val_01.val._M_string_length = sVar3;
    val_01.val.field_2._M_allocated_capacity = uVar10;
    val_01.val.field_2._8_8_ = in_stack_fffffffffffffde8;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar13;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar5;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = pUVar6;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = pUVar7;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pUVar8;
    local_b0.val._M_dataplus._M_p = (pointer)paVar2;
    UniValue::pushKVEnd(__return_storage_ptr__,key_00,val_01);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffe08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffffdf0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var12._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&stack0xfffffffffffffde0) {
      operator_delete(_Var12._M_p,uVar10 + 1);
    }
    if (local_1e0[0] != local_1d0) {
      operator_delete(local_1e0[0],local_1d0[0] + 1);
    }
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.val._M_dataplus._M_p != &local_b0.val.field_2) {
    operator_delete(local_b0.val._M_dataplus._M_p,
                    CONCAT71(local_b0.val.field_2._M_allocated_capacity._1_7_,
                             local_b0.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0013a540:
  __stack_chk_fail();
}

Assistant:

UniValue RPCConvertNamedValues(const std::string &strMethod, const std::vector<std::string> &strParams)
{
    UniValue params(UniValue::VOBJ);
    UniValue positional_args{UniValue::VARR};

    for (std::string_view s: strParams) {
        size_t pos = s.find('=');
        if (pos == std::string::npos) {
            positional_args.push_back(rpcCvtTable.ArgToUniValue(s, strMethod, positional_args.size()));
            continue;
        }

        std::string name{s.substr(0, pos)};
        std::string_view value{s.substr(pos+1)};

        // Intentionally overwrite earlier named values with later ones as a
        // convenience for scripts and command line users that want to merge
        // options.
        params.pushKV(name, rpcCvtTable.ArgToUniValue(value, strMethod, name));
    }

    if (!positional_args.empty()) {
        // Use pushKVEnd instead of pushKV to avoid overwriting an explicit
        // "args" value with an implicit one. Let the RPC server handle the
        // request as given.
        params.pushKVEnd("args", std::move(positional_args));
    }

    return params;
}